

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::parsing::Preprocessor::BranchEntry>::
emplaceRealloc<slang::parsing::Preprocessor::BranchEntry>
          (SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *this,pointer pos,
          BranchEntry *args)

{
  size_type sVar1;
  undefined8 uVar2;
  size_type sVar3;
  size_type sVar4;
  iterator pBVar5;
  long lVar6;
  pointer pBVar7;
  pointer pBVar8;
  iterator __result;
  undefined8 *in_RDX;
  iterator in_RSI;
  SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *in_RDI;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  BranchEntry *in_stack_ffffffffffffffa0;
  iterator __last;
  size_type in_stack_ffffffffffffffb0;
  
  sVar1 = in_RDI->len;
  sVar3 = max_size((SmallVectorBase<slang::parsing::Preprocessor::BranchEntry> *)0xc59c1b);
  if (sVar1 == sVar3) {
    detail::throwLengthError();
  }
  sVar4 = calculateGrowth(in_RDI,in_stack_ffffffffffffffb0);
  __last = in_RSI;
  pBVar5 = begin(in_RDI);
  lVar6 = (long)__last - (long)pBVar5;
  pBVar7 = (pointer)operator_new(0xc59c7d);
  pBVar8 = pBVar7 + lVar6 / 0x18;
  uVar2 = *in_RDX;
  (pBVar8->directive).kind = (short)uVar2;
  (pBVar8->directive).field_0x2 = (char)((ulong)uVar2 >> 0x10);
  (pBVar8->directive).numFlags = (NumericTokenFlags)(char)((ulong)uVar2 >> 0x18);
  (pBVar8->directive).rawLen = (int)((ulong)uVar2 >> 0x20);
  (pBVar8->directive).info = (Info *)in_RDX[1];
  uVar2 = in_RDX[2];
  pBVar8->anyTaken = (bool)(char)uVar2;
  pBVar8->currentActive = (bool)(char)((ulong)uVar2 >> 8);
  pBVar8->hasElse = (bool)(char)((ulong)uVar2 >> 0x10);
  *(int5 *)&pBVar8->field_0x13 = (int5)((ulong)uVar2 >> 0x18);
  pBVar5 = end(in_RDI);
  if (in_RSI == pBVar5) {
    __result = begin(in_RDI);
    pBVar5 = end(in_RDI);
    std::
    uninitialized_move<slang::parsing::Preprocessor::BranchEntry*,slang::parsing::Preprocessor::BranchEntry*>
              (in_RSI,__last,__result);
  }
  else {
    begin(in_RDI);
    std::
    uninitialized_move<slang::parsing::Preprocessor::BranchEntry*,slang::parsing::Preprocessor::BranchEntry*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
    pBVar5 = end(in_RDI);
    std::
    uninitialized_move<slang::parsing::Preprocessor::BranchEntry*,slang::parsing::Preprocessor::BranchEntry*>
              (in_RSI,__last,in_stack_ffffffffffffffa0);
  }
  cleanup(in_RDI,(EVP_PKEY_CTX *)pBVar5);
  in_RDI->len = in_RDI->len + 1;
  in_RDI->cap = sVar4;
  in_RDI->data_ = pBVar7;
  return pBVar8;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}